

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  ushort norm16;
  UCPTrie *trie;
  UBool UVar2;
  int iVar3;
  uint c;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar *unaff_R14;
  bool bVar6;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    do {
      if (limit <= src) {
        return src;
      }
      if ((stopAtCompBoundary != '\0') && ((ushort)*src < (ushort)this->minCompNoMaybeCP)) {
        return src;
      }
      pUVar5 = src + 1;
      UVar1 = *src;
      c = (uint)(ushort)UVar1;
      if ((c & 0xf800) == 0xd800) {
        if ((pUVar5 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
           (UVar1 = *pUVar5, ((ushort)UVar1 & 0xfc00) != 0xdc00)) {
          iVar3 = this->normTrie->dataLength + -1;
        }
        else {
          pUVar5 = src + 2;
          c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          trie = this->normTrie;
          if ((int)c < trie->highStart) {
            iVar3 = ucptrie_internalSmallIndex_63(trie,c);
          }
          else {
            iVar3 = trie->dataLength + -2;
          }
        }
      }
      else {
        iVar3 = (c & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
      }
      norm16 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar3 * 2);
      if ((stopAtCompBoundary == '\0') ||
         ((this->minNoNoCompNoMaybeCC <= norm16 &&
          ((norm16 < this->limitNoNo || (this->minMaybeYes <= norm16)))))) {
        UVar2 = decompose(this,c,norm16,buffer,errorCode);
        if (UVar2 == '\0') {
          pUVar4 = (UChar *)0x0;
          bVar6 = false;
        }
        else if ((stopAtCompBoundary == '\0') || ((norm16 & 1) == 0)) {
LAB_0031a41c:
          bVar6 = true;
          pUVar4 = unaff_R14;
        }
        else {
          bVar6 = false;
          pUVar4 = pUVar5;
          if (onlyContiguous != '\0') {
            if (norm16 == 1) goto LAB_0031a421;
            if (norm16 < this->limitNoNo) {
              bVar6 = *(ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar6 = (norm16 & 6) < 3;
            }
            if (!bVar6) goto LAB_0031a41c;
          }
          bVar6 = false;
        }
      }
      else {
        bVar6 = false;
        pUVar4 = src;
      }
LAB_0031a421:
      src = pUVar5;
      unaff_R14 = pUVar4;
    } while (bVar6);
  }
  else {
    pUVar4 = (UChar *)0x0;
  }
  return pUVar4;
}

Assistant:

const UChar *
Normalizer2Impl::decomposeShort(const UChar *src, const UChar *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while(src<limit) {
        if (stopAtCompBoundary && *src < minCompNoMaybeCP) {
            return src;
        }
        const UChar *prevSrc = src;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
        if (stopAtCompBoundary && norm16HasCompBoundaryBefore(norm16)) {
            return prevSrc;
        }
        if(!decompose(c, norm16, buffer, errorCode)) {
            return nullptr;
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}